

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O1

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
::WriteString(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
              *this,Ch *str,SizeType length)

{
  char cVar1;
  char *pcVar2;
  byte *pbVar3;
  Stack<rapidjson::CrtAllocator> *pSVar4;
  ulong uVar5;
  byte bVar6;
  char **ppcVar7;
  bool bVar8;
  
  pSVar4 = &this->os_->stack_;
  if (pSVar4->stackEnd_ <= pSVar4->stackTop_ + 1) {
    internal::Stack<rapidjson::CrtAllocator>::Expand<char>(pSVar4,1);
  }
  pcVar2 = pSVar4->stackTop_;
  pSVar4->stackTop_ = pcVar2 + 1;
  *pcVar2 = '\"';
  bVar8 = length == 0;
  if (!bVar8) {
    uVar5 = 0;
    do {
      bVar6 = str[uVar5];
      cVar1 = "uuuuuuuubtnufruuuuuuuuuuuuuuuuuu"[bVar6];
      pSVar4 = &this->os_->stack_;
      ppcVar7 = &pSVar4->stackTop_;
      if (cVar1 == '\0') {
        if (pSVar4->stackEnd_ <= pSVar4->stackTop_ + 1) {
LAB_00111895:
          internal::Stack<rapidjson::CrtAllocator>::Expand<char>(pSVar4,1);
        }
LAB_0011189f:
        pbVar3 = (byte *)*ppcVar7;
        *ppcVar7 = (char *)(pbVar3 + 1);
        *pbVar3 = bVar6;
      }
      else {
        if (pSVar4->stackEnd_ <= pSVar4->stackTop_ + 1) {
          internal::Stack<rapidjson::CrtAllocator>::Expand<char>(pSVar4,1);
        }
        pcVar2 = *ppcVar7;
        *ppcVar7 = pcVar2 + 1;
        *pcVar2 = '\\';
        pSVar4 = &this->os_->stack_;
        if (pSVar4->stackEnd_ <= pSVar4->stackTop_ + 1) {
          internal::Stack<rapidjson::CrtAllocator>::Expand<char>(pSVar4,1);
        }
        pcVar2 = pSVar4->stackTop_;
        pSVar4->stackTop_ = pcVar2 + 1;
        *pcVar2 = cVar1;
        if (cVar1 == 'u') {
          pSVar4 = &this->os_->stack_;
          if (pSVar4->stackEnd_ <= pSVar4->stackTop_ + 1) {
            internal::Stack<rapidjson::CrtAllocator>::Expand<char>(pSVar4,1);
          }
          pcVar2 = pSVar4->stackTop_;
          pSVar4->stackTop_ = pcVar2 + 1;
          *pcVar2 = '0';
          pSVar4 = &this->os_->stack_;
          if (pSVar4->stackEnd_ <= pSVar4->stackTop_ + 1) {
            internal::Stack<rapidjson::CrtAllocator>::Expand<char>(pSVar4,1);
          }
          pcVar2 = pSVar4->stackTop_;
          pSVar4->stackTop_ = pcVar2 + 1;
          *pcVar2 = '0';
          pSVar4 = &this->os_->stack_;
          cVar1 = "0123456789ABCDEF"[bVar6 >> 4];
          if (pSVar4->stackEnd_ <= pSVar4->stackTop_ + 1) {
            internal::Stack<rapidjson::CrtAllocator>::Expand<char>(pSVar4,1);
          }
          pcVar2 = pSVar4->stackTop_;
          pSVar4->stackTop_ = pcVar2 + 1;
          *pcVar2 = cVar1;
          pSVar4 = &this->os_->stack_;
          bVar6 = "0123456789ABCDEF"[bVar6 & 0xf];
          ppcVar7 = &pSVar4->stackTop_;
          if (pSVar4->stackEnd_ <= pSVar4->stackTop_ + 1) goto LAB_00111895;
          goto LAB_0011189f;
        }
      }
      uVar5 = uVar5 + 1;
      bVar8 = uVar5 >= length;
    } while (uVar5 < length);
  }
  pSVar4 = &this->os_->stack_;
  if (pSVar4->stackEnd_ <= pSVar4->stackTop_ + 1) {
    internal::Stack<rapidjson::CrtAllocator>::Expand<char>(pSVar4,1);
  }
  pcVar2 = pSVar4->stackTop_;
  pSVar4->stackTop_ = pcVar2 + 1;
  *pcVar2 = '\"';
  return bVar8;
}

Assistant:

bool WriteString(const Ch* str, SizeType length)  {
        static const char hexDigits[16] = { '0', '1', '2', '3', '4', '5', '6', '7', '8', '9', 'A', 'B', 'C', 'D', 'E', 'F' };
        static const char escape[256] = {
#define Z16 0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0
            //0    1    2    3    4    5    6    7    8    9    A    B    C    D    E    F
            'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'b', 't', 'n', 'u', 'f', 'r', 'u', 'u', // 00
            'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', // 10
              0,   0, '"',   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0, // 20
            Z16, Z16,                                                                       // 30~4F
              0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,'\\',   0,   0,   0, // 50
            Z16, Z16, Z16, Z16, Z16, Z16, Z16, Z16, Z16, Z16                                // 60~FF
#undef Z16
        };

        os_->Put('\"');
        GenericStringStream<SourceEncoding> is(str);
        while (is.Tell() < length) {
            const Ch c = is.Peek();
            if (!TargetEncoding::supportUnicode && (unsigned)c >= 0x80) {
                // Unicode escaping
                unsigned codepoint;
                if (!SourceEncoding::Decode(is, &codepoint))
                    return false;
                os_->Put('\\');
                os_->Put('u');
                if (codepoint <= 0xD7FF || (codepoint >= 0xE000 && codepoint <= 0xFFFF)) {
                    os_->Put(hexDigits[(codepoint >> 12) & 15]);
                    os_->Put(hexDigits[(codepoint >>  8) & 15]);
                    os_->Put(hexDigits[(codepoint >>  4) & 15]);
                    os_->Put(hexDigits[(codepoint      ) & 15]);
                }
                else {
                    RAPIDJSON_ASSERT(codepoint >= 0x010000 && codepoint <= 0x10FFFF);
                    // Surrogate pair
                    unsigned s = codepoint - 0x010000;
                    unsigned lead = (s >> 10) + 0xD800;
                    unsigned trail = (s & 0x3FF) + 0xDC00;
                    os_->Put(hexDigits[(lead >> 12) & 15]);
                    os_->Put(hexDigits[(lead >>  8) & 15]);
                    os_->Put(hexDigits[(lead >>  4) & 15]);
                    os_->Put(hexDigits[(lead      ) & 15]);
                    os_->Put('\\');
                    os_->Put('u');
                    os_->Put(hexDigits[(trail >> 12) & 15]);
                    os_->Put(hexDigits[(trail >>  8) & 15]);
                    os_->Put(hexDigits[(trail >>  4) & 15]);
                    os_->Put(hexDigits[(trail      ) & 15]);                    
                }
            }
            else if ((sizeof(Ch) == 1 || (unsigned)c < 256) && escape[(unsigned char)c])  {
                is.Take();
                os_->Put('\\');
                os_->Put(escape[(unsigned char)c]);
                if (escape[(unsigned char)c] == 'u') {
                    os_->Put('0');
                    os_->Put('0');
                    os_->Put(hexDigits[(unsigned char)c >> 4]);
                    os_->Put(hexDigits[(unsigned char)c & 0xF]);
                }
            }
            else
                if (!Transcoder<SourceEncoding, TargetEncoding>::Transcode(is, *os_))
                    return false;
        }
        os_->Put('\"');
        return true;
    }